

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O0

void so_5::impl::msg_tracing_helpers::details::
     make_trace_to<so_5::impl::msg_tracing_helpers::details::overlimit_deep_const&,so_5::agent_t_const*&,so_5::impl::msg_tracing_helpers::details::text_separator,so_5::abstract_message_box_t&,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
               (ostream *s,overlimit_deep *a,agent_t **other,text_separator *other_1,
               abstract_message_box_t *other_2,type_index *other_3,
               intrusive_ptr_t<so_5::message_t> *other_4)

{
  type_index *other_local_3;
  abstract_message_box_t *other_local_2;
  text_separator *other_local_1;
  agent_t **other_local;
  overlimit_deep *a_local;
  ostream *s_local;
  
  make_trace_to_1(s,(overlimit_deep)a->m_deep);
  make_trace_to<so_5::agent_t_const*&,so_5::impl::msg_tracing_helpers::details::text_separator,so_5::abstract_message_box_t&,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
            (s,other,other_1,other_2,other_3,other_4);
  return;
}

Assistant:

void
make_trace_to( std::ostream & s, A && a, OTHER &&... other )
	{
		make_trace_to_1( s, std::forward< A >(a) );
		make_trace_to( s, std::forward< OTHER >(other)... );
	}